

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O2

int main(int argc,char **argv)

{
  instrStruct *piVar1;
  
  if (argc == 2) {
    globalInit();
    inputFile = (FILE *)fopen(argv[1],"r+");
    parser();
    piVar1 = firstInstr;
    while (piVar1 = piVar1->next, piVar1 != (instrStruct *)0x0) {
      fprintf(_stdout,"%d",(ulong)(uint)piVar1->instr);
      fputc(10,_stdout);
    }
    return 0;
  }
  mark("argument error");
  exit(-1);
}

Assistant:

procedure 
int main(int argc, char arg[]) {
	variable int i;
	variable struct instrStruct *element;
	i=0;
	if (argc != 2) {
	   mark("argument error");
	   exit(-1);
	}
	globalInit();
	inputFile = fopen(arg);
	compile();

	element = firstInstr->next;
	while (element != NULL) {
		writeInt(element->instr);
		writeChar('\n');
		element = element->next;
	}
}